

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  int in_ESI;
  KeyValue *in_RDI;
  KeyValue *it;
  KeyValue *end;
  key_type *in_stack_ffffffffffffffc8;
  KeyValue *in_stack_ffffffffffffffd8;
  int local_c [3];
  
  local_c[0] = in_ESI;
  bVar1 = is_large((ExtensionSet *)in_RDI);
  if (bVar1) {
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             *)in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    pKVar2 = flat_end((ExtensionSet *)in_RDI);
    pKVar3 = flat_begin((ExtensionSet *)in_RDI);
    pKVar3 = std::
             lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                       (pKVar3,pKVar2,local_c);
    if ((pKVar3 != pKVar2) && (pKVar3->first == local_c[0])) {
      std::
      copy<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
                (pKVar3,in_stack_ffffffffffffffd8,in_RDI);
      *(short *)((long)&(in_RDI->second).field_0 + 2) =
           *(short *)((long)&(in_RDI->second).field_0 + 2) + -1;
    }
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    std::copy(it + 1, end, it);
    --flat_size_;
  }
}